

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O2

void hexUpper(char *hex)

{
  byte bVar1;
  
  for (; (ulong)(byte)*hex != 0; hex = (char *)((byte *)hex + 2)) {
    bVar1 = hex_dec_table[((byte *)hex)[1]];
    *hex = "0123456789ABCDEF"[(byte)(hex_dec_table[(byte)*hex] << 4 | bVar1) >> 4];
    ((byte *)hex)[1] = "0123456789ABCDEF"[bVar1 & 0xf];
  }
  return;
}

Assistant:

void hexUpper(char* hex)
{
	ASSERT(hexIsValid(hex));
	for (; *hex; hex += 2)
		hexFromOUpper(hex, hexToO(hex));
}